

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *dctx)

{
  U32 dictID;
  ZSTD_DDictHashSet *hashSet;
  size_t sVar1;
  ZSTD_DDict *pZVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (dctx->ddict != (ZSTD_DDict *)0x0) {
    hashSet = dctx->ddictSet;
    dictID = (dctx->fParams).dictID;
    sVar4 = ZSTD_DDictHashSet_getIndex(hashSet,dictID);
    sVar1 = hashSet->ddictPtrTableSize;
    do {
      uVar5 = sVar4;
      uVar3 = ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[uVar5]);
      if (uVar3 == dictID) break;
      sVar4 = (uVar5 & sVar1 - 1) + 1;
    } while (uVar3 != 0);
    pZVar2 = hashSet->ddictPtrTable[uVar5];
    if (pZVar2 != (ZSTD_DDict *)0x0) {
      ZSTD_clearDict(dctx);
      dctx->dictID = (dctx->fParams).dictID;
      dctx->ddict = pZVar2;
      dctx->dictUses = ZSTD_use_indefinitely;
    }
  }
  return;
}

Assistant:

static void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx* dctx) {
    assert(dctx->refMultipleDDicts && dctx->ddictSet);
    DEBUGLOG(4, "Adjusting DDict based on requested dict ID from frame");
    if (dctx->ddict) {
        const ZSTD_DDict* frameDDict = ZSTD_DDictHashSet_getDDict(dctx->ddictSet, dctx->fParams.dictID);
        if (frameDDict) {
            DEBUGLOG(4, "DDict found!");
            ZSTD_clearDict(dctx);
            dctx->dictID = dctx->fParams.dictID;
            dctx->ddict = frameDDict;
            dctx->dictUses = ZSTD_use_indefinitely;
        }
    }
}